

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O2

bool __thiscall
r_comp::Compiler::read_nil_nid
          (Compiler *this,Ptr *node,uint16_t write_index,uint16_t *extent_index,bool write)

{
  bool bVar1;
  Atom *this_00;
  Atom local_24 [4];
  
  bVar1 = std::operator==(&((node->
                            super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>).
                           _M_ptr)->cmd,"|nid");
  if (write && bVar1) {
    r_code::Atom::UndefinedNode();
    this_00 = r_code::vector<r_code::Atom>::operator[]
                        ((vector<r_code::Atom> *)(this->current_object + 8),(ulong)write_index);
    r_code::Atom::operator=(this_00,local_24);
    r_code::Atom::~Atom(local_24);
  }
  return bVar1;
}

Assistant:

bool Compiler::read_nil_nid(RepliStruct::Ptr node, uint16_t write_index, uint16_t &extent_index, bool write)
{
    if (node->cmd == "|nid") {
        if (write) {
            current_object->code[write_index] = Atom::UndefinedNode();
        }

        return true;
    }

    return false;
}